

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

double __thiscall Quat4f::exp(Quat4f *this,double __x)

{
  long in_RSI;
  float fVar1;
  float fVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  float coeff;
  float theta;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar5 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI + 4)),ZEXT416(*(uint *)(in_RSI + 4)),
                           ZEXT416((uint)(*(float *)(in_RSI + 8) * *(float *)(in_RSI + 8))));
  auVar5 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI + 0xc)),ZEXT416(*(uint *)(in_RSI + 0xc)),auVar5)
  ;
  dVar3 = sqrt((double)auVar5._0_4_);
  fVar1 = (float)dVar3;
  if (1e-06 <= fVar1) {
    dVar3 = sin((double)fVar1);
    fVar2 = (float)(dVar3 / (double)fVar1);
    auVar7._0_8_ = cos((double)fVar1);
    auVar7._8_56_ = extraout_var_00;
    auVar5._0_4_ = (float)auVar7._0_8_;
    auVar5._4_12_ = auVar7._4_12_;
    dVar3 = auVar5._0_8_;
    Quat4f(this,auVar5._0_4_,*(float *)(in_RSI + 4) * fVar2,*(float *)(in_RSI + 8) * fVar2,
           *(float *)(in_RSI + 0xc) * fVar2);
  }
  else {
    auVar6._0_8_ = cos((double)fVar1);
    auVar6._8_56_ = extraout_var;
    auVar4._0_4_ = (float)auVar6._0_8_;
    auVar4._4_12_ = auVar6._4_12_;
    dVar3 = auVar4._0_8_;
    Quat4f(this,auVar4._0_4_,*(float *)(in_RSI + 4),*(float *)(in_RSI + 8),*(float *)(in_RSI + 0xc))
    ;
  }
  return dVar3;
}

Assistant:

Quat4f Quat4f::exp() const
{
	float theta =
		sqrt
		(
			m_elements[ 1 ] * m_elements[ 1 ] +
			m_elements[ 2 ] * m_elements[ 2 ] +
			m_elements[ 3 ] * m_elements[ 3 ]
		);

	if( theta < 1e-6 )
	{
		return Quat4f( cos( theta ), m_elements[ 1 ], m_elements[ 2 ], m_elements[ 3 ] );
	}
	else
	{
		float coeff = sin( theta ) / theta;
		return Quat4f( cos( theta ), m_elements[ 1 ] * coeff, m_elements[ 2 ] * coeff, m_elements[ 3 ] * coeff );		
	}
}